

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_renderer_scanline.h
# Opt level: O0

void agg::
     render_scanline_aa_solid<agg::scanline_p8,agg::renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,agg::order_bgra>,agg::row_accessor<unsigned_char>>>,agg::rgba8T<agg::linear>>
               (scanline_p8 *sl,
               renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
               *ren,rgba8T<agg::linear> *color)

{
  int y_00;
  int x1;
  const_iterator psStack_30;
  int x;
  const_iterator span;
  uint num_spans;
  int y;
  rgba8T<agg::linear> *color_local;
  renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
  *ren_local;
  scanline_p8 *sl_local;
  
  y_00 = scanline_p8::y(sl);
  span._0_4_ = scanline_p8::num_spans(sl);
  psStack_30 = scanline_p8::begin(sl);
  while( true ) {
    x1 = (int)psStack_30->x;
    if (psStack_30->len < 1) {
      renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
      ::blend_hline(ren,x1,y_00,(x1 - psStack_30->len) + -1,color,*psStack_30->covers);
    }
    else {
      renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
      ::blend_solid_hspan(ren,x1,y_00,(int)psStack_30->len,color,psStack_30->covers);
    }
    span._0_4_ = (uint)span - 1;
    if ((uint)span == 0) break;
    psStack_30 = psStack_30 + 1;
  }
  return;
}

Assistant:

void render_scanline_aa_solid(const Scanline& sl, 
                                  BaseRenderer& ren, 
                                  const ColorT& color)
    {
        int y = sl.y();
        unsigned num_spans = sl.num_spans();
        typename Scanline::const_iterator span = sl.begin();

        for(;;)
        {
            int x = span->x;
            if(span->len > 0)
            {
                ren.blend_solid_hspan(x, y, (unsigned)span->len, 
                                      color, 
                                      span->covers);
            }
            else
            {
                ren.blend_hline(x, y, (unsigned)(x - span->len - 1), 
                                color, 
                                *(span->covers));
            }
            if(--num_spans == 0) break;
            ++span;
        }
    }